

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSort.cpp
# Opt level: O0

int sortTwoFiles(string *file1,string *file2)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  undefined8 uVar8;
  long *plVar9;
  ostream *poVar10;
  int local_640;
  bool fileContinue2;
  bool fileContinue1;
  bool fileValue2Used;
  bool fileValue1Used;
  int fileValue2;
  int fileValue1;
  ofstream outFileStream;
  long local_428;
  ifstream fileStream2;
  long local_220;
  ifstream fileStream1;
  string *file2_local;
  string *file1_local;
  
  std::ifstream::ifstream(&local_220);
  std::ifstream::ifstream(&local_428);
  std::ofstream::ofstream(&fileValue2);
  uVar8 = std::__cxx11::string::c_str();
  std::ifstream::open(&local_220,uVar8,8);
  uVar8 = std::__cxx11::string::c_str();
  std::ifstream::open(&local_428,uVar8,8);
  std::ofstream::open(&fileValue2,OUT_FILE_NAME,0x10);
  bVar3 = true;
  bVar5 = true;
  bVar2 = true;
  bVar4 = true;
  bVar6 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (((bVar6) &&
      (bVar6 = std::ios::operator_cast_to_bool
                         ((ios *)((long)&local_428 + *(long *)(local_428 + -0x18))), bVar6)) &&
     (bVar6 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&fileValue2 + *(long *)(_fileValue2 + -0x18))), bVar6)) {
    do {
      if ((bVar2) && (bVar3)) {
        plVar9 = (long *)std::istream::operator>>((istream *)&local_220,(int *)&fileContinue2);
        bVar6 = std::ios::operator_cast_to_bool((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
        if (bVar6) {
          bVar3 = false;
        }
        else {
          bVar2 = false;
        }
      }
      if ((bVar4) && (bVar5)) {
        plVar9 = (long *)std::istream::operator>>((istream *)&local_428,&local_640);
        bVar6 = std::ios::operator_cast_to_bool((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
        if (bVar6) {
          bVar5 = false;
        }
        else {
          bVar4 = false;
        }
      }
      if ((bVar2) || (!bVar4)) {
        if ((!bVar2) || (bVar4)) {
          if (((local_640 < _fileContinue2) && (bVar2)) && (bVar4)) {
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&fileValue2,local_640);
            std::operator<<(poVar10,'\n');
            bVar5 = true;
          }
          else if (((_fileContinue2 < local_640) && (bVar2)) && (bVar4)) {
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&fileValue2,_fileContinue2);
            std::operator<<(poVar10,'\n');
            bVar3 = true;
          }
          else if (((_fileContinue2 == local_640) && (bVar2)) && (bVar4)) {
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&fileValue2,_fileContinue2);
            poVar10 = std::operator<<(poVar10,'\n');
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_640);
            std::operator<<(poVar10,'\n');
            bVar3 = true;
            bVar5 = true;
          }
        }
        else {
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&fileValue2,_fileContinue2);
          std::operator<<(poVar10,'\n');
          bVar3 = true;
        }
      }
      else {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&fileValue2,local_640);
        std::operator<<(poVar10,'\n');
        bVar5 = true;
      }
      bVar6 = true;
      if (!bVar2) {
        bVar6 = bVar4;
      }
    } while (bVar6);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"ERROR!");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    bVar7 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
    if ((bVar7 & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Unable to read from file: ");
      poVar10 = std::operator<<(poVar10,(string *)file1);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    bVar7 = std::ios::operator!((ios *)((long)&local_428 + *(long *)(local_428 + -0x18)));
    if ((bVar7 & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Unable to read from file: ");
      poVar10 = std::operator<<(poVar10,(string *)file2);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    bVar7 = std::ios::operator!((ios *)((long)&fileValue2 + *(long *)(_fileValue2 + -0x18)));
    if ((bVar7 & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Unable to write to file: ");
      poVar10 = std::operator<<(poVar10,OUT_FILE_NAME);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ifstream::close();
  std::ifstream::close();
  std::ofstream::close();
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int sortTwoFiles(std::string file1, std::string file2)
{
    std::ifstream fileStream1;
    std::ifstream fileStream2;
    std::ofstream outFileStream;

    //open files for reading and check to make sure we don't have any errors

    fileStream1.open(file1.c_str());
    fileStream2.open(file2.c_str());
    outFileStream.open(OUT_FILE_NAME);


    int fileValue1;
    int fileValue2;
    bool fileValue1Used = true;
    bool fileValue2Used = true;
    bool fileContinue1 = true;
    bool fileContinue2 = true;

    if(fileStream1 && fileStream2 && outFileStream)
    {
        //if we have gotten this far, we can read or write to all files
        do
        {
            //Populate our variables and see if we need to keep populating from a
            //given file
            if(fileContinue1 && fileValue1Used)
            {
                if (fileStream1 >> fileValue1)
                {
                    fileValue1Used = false;
                }
                else
                {
                    fileContinue1 = false;
                }
            }
            if(fileContinue2 && fileValue2Used)
            {
                if (fileStream2 >> fileValue2)
                {
                    fileValue2Used = false;
                }
                else
                {
                    fileContinue2 = false;

                }
            }

            //Now the logic to write out...

            if(!fileContinue1 && fileContinue2)
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;


            }
            else if(fileContinue1 && !fileContinue2)
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 > fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;
            }
            else if((fileValue1 < fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 == fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n' << fileValue2 << '\n';
                fileValue1Used = true;
                fileValue2Used = true;
            }



        } while(fileContinue1 || fileContinue2);

    }
    else
    {
        std::cout << "ERROR!" << std::endl;

        if(!fileStream1)
        {
            std::cout << "Unable to read from file: " << file1 << std::endl;
        }
        if(!fileStream2)
        {
            std::cout << "Unable to read from file: " << file2 << std::endl;
        }
        if(!outFileStream)
        {
            std::cout << "Unable to write to file: " << OUT_FILE_NAME << std::endl;
        }
    }

    fileStream1.close();
    fileStream2.close();
    outFileStream.close();


}